

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

iterator __thiscall
QJsonObject::insertAt<QLatin1String>
          (QJsonObject *this,qsizetype pos,QLatin1String key,QJsonValue *value,bool keyExists)

{
  QJsonValueRef QVar1;
  QLatin1StringView s;
  bool bVar2;
  QCborContainerPrivate *pQVar3;
  QCborContainerPrivate *pQVar4;
  QCborValue *value_00;
  long in_RSI;
  byte in_R9B;
  long in_FS_OFFSET;
  QCborContainerPrivate *in_stack_fffffffffffffed8;
  QCborContainerPrivate *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  ContainerDisposition in_stack_fffffffffffffeec;
  QCborValue *in_stack_fffffffffffffef0;
  ContainerDisposition CVar5;
  QCborValue *in_stack_fffffffffffffef8;
  QCborContainerPrivate *in_stack_ffffffffffffff00;
  undefined1 *idx;
  QJsonValue *in_stack_ffffffffffffff28;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x496212);
  if (bVar2) {
    pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x496222);
    QList<QtCbor::Element>::size(&pQVar3->elements);
    detach((QJsonObject *)in_stack_fffffffffffffef8,(qsizetype)in_stack_fffffffffffffef0);
  }
  else {
    operator_new(0x40);
    QCborContainerPrivate::QCborContainerPrivate(in_stack_fffffffffffffee0);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
  }
  if ((in_R9B & 1) == 0) {
    pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x496325);
    CVar5 = (ContainerDisposition)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    s.m_data = (char *)pQVar3;
    s.m_size = (qsizetype)in_stack_ffffffffffffff00;
    ::QCborValue::QCborValue
              ((QCborValue *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),s);
    QCborContainerPrivate::insertAt
              (pQVar3,(qsizetype)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,CVar5);
    ::QCborValue::~QCborValue((QCborValue *)in_stack_fffffffffffffee0);
    pQVar4 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x496398);
    CVar5 = (ContainerDisposition)((ulong)pQVar4 >> 0x20);
    value_00 = (QCborValue *)(in_RSI + 1);
    idx = local_50;
    ::QCborValue::fromJsonValue(in_stack_ffffffffffffff28);
    QCborContainerPrivate::insertAt(pQVar3,(qsizetype)idx,value_00,CVar5);
    ::QCborValue::~QCborValue((QCborValue *)in_stack_fffffffffffffee0);
  }
  else {
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x49629e);
    ::QCborValue::fromJsonValue((QJsonValue *)(in_RSI + 1));
    QCborContainerPrivate::replaceAt
              (in_stack_ffffffffffffff00,(qsizetype)in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    ::QCborValue::~QCborValue((QCborValue *)in_stack_fffffffffffffee0);
  }
  iterator::iterator((iterator *)in_stack_fffffffffffffee0,(QJsonObject *)in_stack_fffffffffffffed8,
                     0x49645a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.super_QJsonValueConstRef._8_4_ = (int)local_58;
    QVar1.super_QJsonValueConstRef.field_0 =
         (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)local_60;
    QVar1.super_QJsonValueConstRef._12_4_ = (int)((ulong)local_58 >> 0x20);
    return (QJsonValueRef)(QJsonValueRef)QVar1.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::insertAt(qsizetype pos, T key, const QJsonValue &value, bool keyExists)
{
    if (o)
        detach(o->elements.size() / 2 + (keyExists ? 0 : 1));
    else
        o = new QCborContainerPrivate;

    if (keyExists) {
        o->replaceAt(pos + 1, QCborValue::fromJsonValue(value));
    } else {
        o->insertAt(pos, key);
        o->insertAt(pos + 1, QCborValue::fromJsonValue(value));
    }
    return {this, pos / 2};
}